

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int ngram_model_casefold(ngram_model_t *model,int kase)

{
  uint8 uVar1;
  hash_table_t *h;
  void *pvVar2;
  char *local_30;
  char *outstr;
  hash_table_t *new_wid;
  int i;
  int writable;
  int kase_local;
  ngram_model_t *model_local;
  
  uVar1 = model->writable;
  model->writable = '\x01';
  h = hash_table_new(model->n_words,0);
  for (new_wid._4_4_ = 0; new_wid._4_4_ < model->n_words; new_wid._4_4_ = new_wid._4_4_ + 1) {
    if (uVar1 == '\0') {
      local_30 = __ckd_salloc__(model->word_str[new_wid._4_4_],
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                ,0x147);
    }
    else {
      local_30 = model->word_str[new_wid._4_4_];
    }
    if ((*local_30 != '<') && (*local_30 != '[')) {
      if (kase == 0) {
        ucase(local_30);
      }
      else if (kase == 1) {
        lcase(local_30);
      }
    }
    model->word_str[new_wid._4_4_] = local_30;
    pvVar2 = hash_table_enter(h,model->word_str[new_wid._4_4_],(void *)(long)new_wid._4_4_);
    if ((int)pvVar2 != new_wid._4_4_) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
              ,0x15e,"Duplicate word in dictionary after conversion: %s\n",
              model->word_str[new_wid._4_4_]);
    }
  }
  hash_table_free(model->wid);
  model->wid = h;
  return 0;
}

Assistant:

int
ngram_model_casefold(ngram_model_t * model, int kase)
{
    int writable, i;
    hash_table_t *new_wid;

    /* Were word strings already allocated? */
    writable = model->writable;
    /* Either way, we are going to allocate some word strings. */
    model->writable = TRUE;

    /* And, don't forget, we need to rebuild the word to unigram ID
     * mapping. */
    new_wid = hash_table_new(model->n_words, FALSE);
    for (i = 0; i < model->n_words; ++i) {
        char *outstr;
        if (writable) {
            outstr = model->word_str[i];
        }
        else {
            outstr = ckd_salloc(model->word_str[i]);
        }
        /* Don't case-fold <tags> or [classes] */
        if (outstr[0] == '<' || outstr[0] == '[') {
        }
        else {
            switch (kase) {
            case NGRAM_UPPER:
                ucase(outstr);
                break;
            case NGRAM_LOWER:
                lcase(outstr);
                break;
            default:
                ;
            }
        }
        model->word_str[i] = outstr;

        /* Now update the hash table.  We might have terrible
         * collisions here, so warn about them. */
        if (hash_table_enter_int32(new_wid, model->word_str[i], i) != i) {
            E_WARN("Duplicate word in dictionary after conversion: %s\n",
                   model->word_str[i]);
        }
    }
    /* Swap out the hash table. */
    hash_table_free(model->wid);
    model->wid = new_wid;
    return 0;
}